

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie-pfx.c
# Opt level: O0

int pfx_table_remove_id(pfx_table *pfx_table,trie_node **root,trie_node *node,rtr_socket *socket,
                       uint level)

{
  node_data *data_00;
  bool bVar1;
  int iVar2;
  trie_node *ptr;
  long in_FS_OFFSET;
  bool bVar3;
  trie_node *rm_node;
  uint i;
  node_data *data;
  _Bool check_node;
  uint level_local;
  rtr_socket *socket_local;
  trie_node *node_local;
  trie_node **root_local;
  pfx_table *pfx_table_local;
  undefined1 local_38 [8];
  pfx_record record;
  
  record.socket = *(rtr_socket **)(in_FS_OFFSET + 0x28);
  if (node == (trie_node *)0x0) {
    __assert_fail("node",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x1d7,
                  "int pfx_table_remove_id(struct pfx_table *, struct trie_node **, struct trie_node *, const struct rtr_socket *, const unsigned int)"
                 );
  }
  if (root == (trie_node **)0x0) {
    __assert_fail("root",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x1d8,
                  "int pfx_table_remove_id(struct pfx_table *, struct trie_node **, struct trie_node *, const struct rtr_socket *, const unsigned int)"
                 );
  }
  if (*root == (trie_node *)0x0) {
    __assert_fail("*root",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                  ,0x1d9,
                  "int pfx_table_remove_id(struct pfx_table *, struct trie_node **, struct trie_node *, const struct rtr_socket *, const unsigned int)"
                 );
  }
  bVar1 = true;
  do {
    while( true ) {
      if (!bVar1) {
        if ((node->lchild == (trie_node *)0x0) ||
           (iVar2 = pfx_table_remove_id(pfx_table,root,node->lchild,socket,level + 1), iVar2 != -1))
        {
          if (node->rchild == (trie_node *)0x0) {
            pfx_table_local._4_4_ = 0;
          }
          else {
            pfx_table_local._4_4_ =
                 pfx_table_remove_id(pfx_table,root,node->rchild,socket,level + 1);
          }
        }
        else {
          pfx_table_local._4_4_ = -1;
        }
        goto LAB_00109e54;
      }
      data_00 = (node_data *)node->data;
      for (rm_node._4_4_ = 0; rm_node._4_4_ < data_00->len; rm_node._4_4_ = rm_node._4_4_ + 1) {
        while( true ) {
          bVar3 = false;
          if (rm_node._4_4_ < data_00->len) {
            bVar3 = data_00->ary[rm_node._4_4_].socket == socket;
          }
          if (!bVar3) break;
          local_38._0_4_ = data_00->ary[rm_node._4_4_].asn;
          unique0x00012000 = *(undefined8 *)&node->prefix;
          record.prefix._0_8_ = *(undefined8 *)((long)&(node->prefix).u + 4);
          record.prefix.u.addr6.addr[1] = (node->prefix).u.addr6.addr[3];
          record.prefix.u.addr6.addr[2]._0_1_ = node->len;
          record.prefix.u.addr6.addr[2]._1_1_ = data_00->ary[rm_node._4_4_].max_len;
          record._24_8_ = data_00->ary[rm_node._4_4_].socket;
          iVar2 = pfx_table_del_elem(data_00,rm_node._4_4_);
          if (iVar2 == -1) {
            pfx_table_local._4_4_ = -1;
            goto LAB_00109e54;
          }
          pfx_table_notify_clients(pfx_table,(pfx_record *)local_38,false);
        }
      }
      if (data_00->len == 0) break;
      bVar1 = false;
    }
    ptr = trie_remove(node,&node->prefix,node->len,level);
    if (ptr == (trie_node *)0x0) {
      __assert_fail("rm_node",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                    ,0x1ed,
                    "int pfx_table_remove_id(struct pfx_table *, struct trie_node **, struct trie_node *, const struct rtr_socket *, const unsigned int)"
                   );
    }
    if (*ptr->data != 0) {
      __assert_fail("((struct node_data *)rm_node->data)->len == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/pfx/trie/trie-pfx.c"
                    ,0x1ee,
                    "int pfx_table_remove_id(struct pfx_table *, struct trie_node **, struct trie_node *, const struct rtr_socket *, const unsigned int)"
                   );
    }
    lrtr_free(ptr->data);
    lrtr_free(ptr);
    if (ptr == *root) {
      *root = (trie_node *)0x0;
      pfx_table_local._4_4_ = 0;
      goto LAB_00109e54;
    }
  } while (ptr != node);
  pfx_table_local._4_4_ = 0;
LAB_00109e54:
  if (*(rtr_socket **)(in_FS_OFFSET + 0x28) != record.socket) {
    __stack_chk_fail();
  }
  return pfx_table_local._4_4_;
}

Assistant:

int pfx_table_remove_id(struct pfx_table *pfx_table, struct trie_node **root, struct trie_node *node,
			const struct rtr_socket *socket, const unsigned int level)
{
	assert(node);
	assert(root);
	assert(*root);
	bool check_node = true;

	while (check_node) {
		// data from removed node are replaced from data from child nodes (if children exists),
		// same node must be checked again if it was replaced with previous child node data
		struct node_data *data = node->data;

		for (unsigned int i = 0; i < data->len; i++) {
			while (data->len > i && data->ary[i].socket == socket) {
				struct pfx_record record = {data->ary[i].asn, node->prefix, node->len,
							    data->ary[i].max_len, data->ary[i].socket};
				if (pfx_table_del_elem(data, i) == PFX_ERROR)
					return PFX_ERROR;
				pfx_table_notify_clients(pfx_table, &record, false);
			}
		}
		if (data->len == 0) {
			struct trie_node *rm_node = trie_remove(node, &(node->prefix), node->len, level);

			assert(rm_node);
			assert(((struct node_data *)rm_node->data)->len == 0);
			lrtr_free(((struct node_data *)rm_node->data));
			lrtr_free(rm_node);

			if (rm_node == *root) {
				*root = NULL;
				return PFX_SUCCESS;
			} else if (rm_node == node) {
				return PFX_SUCCESS;
			}
		} else {
			check_node = false;
		}
	}

	if (node->lchild) {
		if (pfx_table_remove_id(pfx_table, root, node->lchild, socket, level + 1) == PFX_ERROR)
			return PFX_ERROR;
	}
	if (node->rchild)
		return pfx_table_remove_id(pfx_table, root, node->rchild, socket, level + 1);
	return PFX_SUCCESS;
}